

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

jx9_value * VmExtractSuper(jx9_vm *pVm,char *zName,sxu32 nByte)

{
  SyHashEntry_Pr *pSVar1;
  jx9_value *pjVar2;
  
  pSVar1 = (SyHashEntry_Pr *)0x0;
  if ((nByte != 0) && ((pVm->hSuper).nEntry != 0)) {
    pSVar1 = HashGetEntry(&pVm->hSuper,zName,nByte);
  }
  if ((pSVar1 == (SyHashEntry_Pr *)0x0) || ((pVm->aMemObj).nUsed <= *(uint *)&pSVar1->pUserData)) {
    pjVar2 = (jx9_value *)0x0;
  }
  else {
    pjVar2 = (jx9_value *)
             ((ulong)(*(uint *)&pSVar1->pUserData * (pVm->aMemObj).eSize) +
             (long)(pVm->aMemObj).pBase);
  }
  return pjVar2;
}

Assistant:

static jx9_value * VmExtractSuper(
	jx9_vm *pVm,       /* Target VM */
	const char *zName, /* Superglobal name: NOT NULL TERMINATED */
	sxu32 nByte        /* zName length */
	)
{
	SyHashEntry *pEntry;
	jx9_value *pValue;
	sxu32 nIdx;
	/* Query the superglobal table */
	pEntry = SyHashGet(&pVm->hSuper, (const void *)zName, nByte);
	if( pEntry == 0 ){
		/* No such entry */
		return 0;
	}
	/* Extract the superglobal index in the global object pool */
	nIdx = SX_PTR_TO_INT(pEntry->pUserData);
	/* Extract the variable value  */
	pValue = (jx9_value *)SySetAt(&pVm->aMemObj, nIdx);
	return pValue;
}